

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O2

FT_F26Dot6 Round_Super_45(TT_ExecContext exc,FT_F26Dot6 distance,FT_F26Dot6 compensation)

{
  long lVar1;
  long lVar2;
  
  lVar1 = exc->phase;
  if (distance < 0) {
    lVar2 = (exc->threshold + compensation) - (distance + lVar1);
    lVar2 = lVar2 % exc->period - (lVar2 + lVar1);
    if (0 < lVar2) {
      lVar2 = -lVar1;
    }
  }
  else {
    lVar2 = compensation + distance + (exc->threshold - lVar1);
    lVar2 = (lVar2 - lVar2 % exc->period) + lVar1;
    if (lVar2 < 0) {
      lVar2 = lVar1;
    }
  }
  return lVar2;
}

Assistant:

static FT_F26Dot6
  Round_Super_45( TT_ExecContext  exc,
                  FT_F26Dot6      distance,
                  FT_F26Dot6      compensation )
  {
    FT_F26Dot6  val;


    if ( distance >= 0 )
    {
      val = ( ADD_LONG( distance,
                        exc->threshold - exc->phase + compensation ) /
                exc->period ) * exc->period;
      val += exc->phase;
      if ( val < 0 )
        val = exc->phase;
    }
    else
    {
      val = NEG_LONG( ( SUB_LONG( exc->threshold - exc->phase + compensation,
                                  distance ) /
                          exc->period ) * exc->period );
      val -= exc->phase;
      if ( val > 0 )
        val = -exc->phase;
    }

    return val;
  }